

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::SentencePieceText_SentencePiece
          (SentencePieceText_SentencePiece *this,Arena *arena)

{
  HasBits<1UL> *local_48;
  Arena *arena_local;
  SentencePieceText_SentencePiece *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__SentencePieceText_SentencePiece_0039d2d8;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  local_48 = &this->_has_bits_;
  do {
    local_48->has_bits_[0] = 0;
    local_48 = local_48 + 1;
  } while (local_48 != (HasBits<1UL> *)&this->_cached_size_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  SharedCtor(this);
  RegisterArenaDtor(this,arena);
  return;
}

Assistant:

SentencePieceText_SentencePiece::SentencePieceText_SentencePiece(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.SentencePieceText.SentencePiece)
}